

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_cpp.cpp
# Opt level: O0

void __thiscall
flatbuffers::cpp::CppGenerator::GenBuilders(CppGenerator *this,StructDef *struct_def)

{
  FieldDef *this_00;
  Namespace *this_01;
  const_reverse_iterator cVar1;
  StructDef *object;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  reference ppFVar5;
  vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> *pvVar6;
  reference ppFVar7;
  __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
  _Var8;
  byte local_d79;
  allocator<char> local_d39;
  string local_d38;
  allocator<char> local_d11;
  string local_d10;
  allocator<char> local_ce9;
  string local_ce8;
  allocator<char> local_cc1;
  string local_cc0;
  allocator<char> local_c99;
  string local_c98;
  string local_c78;
  allocator<char> local_c51;
  string local_c50;
  reference local_c30;
  FieldDef **field_5;
  const_iterator __end3_1;
  const_iterator __begin3_1;
  vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> *__range3_1;
  string local_c08;
  allocator<char> local_be1;
  string local_be0;
  anon_class_8_1_8991fb9c local_bc0;
  function<void_(const_flatbuffers::FieldDef_*)> local_bb8;
  allocator<char> local_b91;
  string local_b90;
  string local_b70;
  allocator<char> local_b49;
  string local_b48;
  allocator<char> local_b21;
  string local_b20;
  undefined1 local_b00 [8];
  string qualified_create_name;
  FieldDef **field_4;
  const_iterator __end3;
  const_iterator __begin3;
  vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> *__range3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_aa0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a80;
  allocator<char> local_a59;
  string local_a58;
  allocator<char> local_a31;
  string local_a30;
  allocator<char> local_a09;
  string local_a08;
  allocator<char> local_9e1;
  string local_9e0;
  allocator<char> local_9b9;
  string local_9b8;
  allocator<char> local_991;
  string local_990;
  string local_970;
  allocator<char> local_949;
  string local_948;
  FieldDef *local_928;
  FieldDef *field_3;
  undefined1 local_918 [8];
  const_reverse_iterator it_1;
  size_t size;
  string local_900;
  allocator<char> local_8d9;
  string local_8d8;
  reference local_8b8;
  FieldDef **field_2;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> *__range2_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_878;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_858;
  allocator<char> local_831;
  string local_830;
  allocator<char> local_809;
  string local_808;
  allocator<char> local_7e1;
  string local_7e0;
  allocator<char> local_7b9;
  string local_7b8;
  allocator<char> local_791;
  string local_790;
  allocator<char> local_769;
  string local_768;
  string local_748;
  allocator<char> local_721;
  string local_720;
  string local_700;
  allocator<char> local_6d9;
  string local_6d8;
  reference local_6b8;
  FieldDef **field_1;
  const_iterator __end2;
  const_iterator __begin2;
  vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> *__range2;
  string local_690;
  allocator<char> local_669;
  string local_668;
  allocator<char> local_641;
  string local_640;
  allocator<char> local_619;
  string local_618;
  allocator<char> local_5f1;
  string local_5f0;
  allocator<char> local_5c9;
  string local_5c8;
  string local_5a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_588;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_568;
  allocator<char> local_541;
  string local_540;
  allocator<char> local_519;
  string local_518;
  allocator<char> local_4f1;
  string local_4f0;
  allocator<char> local_4c9;
  string local_4c8;
  allocator<char> local_4a1;
  string local_4a0;
  allocator<char> local_479;
  string local_478;
  allocator<char> local_451;
  string local_450;
  allocator<char> local_429;
  string local_428;
  allocator<char> local_401;
  string local_400;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c0;
  allocator<char> local_399;
  string local_398;
  undefined1 local_378 [8];
  string type;
  string local_350;
  allocator<char> local_329;
  string local_328;
  string local_308;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  allocator<char> local_2a1;
  string local_2a0;
  string local_280;
  allocator<char> local_259;
  string local_258;
  string local_238;
  allocator<char> local_211;
  string local_210;
  byte local_1ea;
  allocator<char> local_1e9;
  undefined1 local_1e8 [8];
  string value;
  undefined1 local_1a8 [8];
  string name;
  string offset;
  bool is_vector;
  bool is_string;
  bool is_default_scalar;
  bool is_scalar;
  FieldDef *field;
  __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
  local_150;
  const_iterator it;
  undefined1 local_140 [6];
  bool has_string_or_vector_fields;
  string local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  allocator<char> local_b9;
  string local_b8;
  allocator<char> local_91;
  string local_90;
  string local_70;
  allocator<char> local_39;
  string local_38;
  StructDef *local_18;
  StructDef *struct_def_local;
  CppGenerator *this_local;
  
  local_18 = struct_def;
  struct_def_local = (StructDef *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"STRUCT_NAME",&local_39);
  Name_abi_cxx11_(&local_70,this,&local_18->super_Definition);
  CodeWriter::SetValue(&this->code_,&local_38,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,"struct {{STRUCT_NAME}}Builder {",&local_91);
  CodeWriter::operator+=(&this->code_,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator(&local_91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,"  typedef {{STRUCT_NAME}} Table;",&local_b9);
  CodeWriter::operator+=(&this->code_,&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator(&local_b9);
  GetBuilder_abi_cxx11_(&local_120,this);
  std::operator+(&local_100,"  ",&local_120);
  std::operator+(&local_e0,&local_100," &fbb_;");
  CodeWriter::operator+=(&this->code_,&local_e0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)&local_120);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_140,"  ::flatbuffers::uoffset_t start_;",
             (allocator<char> *)((long)&it._M_current + 7));
  CodeWriter::operator+=(&this->code_,(string *)local_140);
  std::__cxx11::string::~string((string *)local_140);
  std::allocator<char>::~allocator((allocator<char> *)((long)&it._M_current + 7));
  it._M_current._6_1_ = 0;
  local_150._M_current =
       (FieldDef **)
       std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::begin
                 (&(local_18->fields).vec);
  while( true ) {
    field = (FieldDef *)
            std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::end
                      (&(local_18->fields).vec);
    bVar2 = __gnu_cxx::operator!=
                      (&local_150,
                       (__normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
                        *)&field);
    if (!bVar2) break;
    ppFVar5 = __gnu_cxx::
              __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
              ::operator*(&local_150);
    this_00 = *ppFVar5;
    if ((this_00->deprecated & 1U) == 0) {
      bVar2 = IsScalar((this_00->value).type.base_type);
      local_d79 = 0;
      if (bVar2) {
        bVar3 = FieldDef::IsScalarOptional(this_00);
        local_d79 = bVar3 ^ 0xff;
      }
      bVar3 = IsString(&(this_00->value).type);
      bVar4 = IsVector(&(this_00->value).type);
      if ((bVar3) || (bVar4)) {
        it._M_current._6_1_ = 1;
      }
      GenFieldOffsetName_abi_cxx11_((string *)((long)&name.field_2 + 8),this,this_00);
      Name_abi_cxx11_((string *)((long)&value.field_2 + 8),this,this_00);
      GenUnderlyingCast((string *)local_1a8,this,this_00,false,(string *)((long)&value.field_2 + 8))
      ;
      std::__cxx11::string::~string((string *)(value.field_2._M_local_buf + 8));
      local_1ea = 0;
      if ((local_d79 & 1) == 0) {
        std::allocator<char>::allocator();
        local_1ea = 1;
        std::__cxx11::string::string<std::allocator<char>>((string *)local_1e8,"",&local_1e9);
      }
      else {
        GenDefaultConstant_abi_cxx11_((string *)local_1e8,this,this_00);
      }
      if ((local_1ea & 1) != 0) {
        std::allocator<char>::~allocator(&local_1e9);
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_210,"FIELD_NAME",&local_211);
      Name_abi_cxx11_(&local_238,this,this_00);
      CodeWriter::SetValue(&this->code_,&local_210,&local_238);
      std::__cxx11::string::~string((string *)&local_238);
      std::__cxx11::string::~string((string *)&local_210);
      std::allocator<char>::~allocator(&local_211);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_258,"FIELD_TYPE",&local_259);
      GenTypeWire_abi_cxx11_
                (&local_280,this,&(this_00->value).type," ",true,(bool)(this_00->offset64 & 1));
      CodeWriter::SetValue(&this->code_,&local_258,&local_280);
      std::__cxx11::string::~string((string *)&local_280);
      std::__cxx11::string::~string((string *)&local_258);
      std::allocator<char>::~allocator(&local_259);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2a0,"ADD_OFFSET",&local_2a1);
      Name_abi_cxx11_(&local_308,this,&local_18->super_Definition);
      std::operator+(&local_2e8,&local_308,"::");
      std::operator+(&local_2c8,&local_2e8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&name.field_2 + 8));
      CodeWriter::SetValue(&this->code_,&local_2a0,&local_2c8);
      std::__cxx11::string::~string((string *)&local_2c8);
      std::__cxx11::string::~string((string *)&local_2e8);
      std::__cxx11::string::~string((string *)&local_308);
      std::__cxx11::string::~string((string *)&local_2a0);
      std::allocator<char>::~allocator(&local_2a1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_328,"ADD_NAME",&local_329)
      ;
      CodeWriter::SetValue(&this->code_,&local_328,(string *)local_1a8);
      std::__cxx11::string::~string((string *)&local_328);
      std::allocator<char>::~allocator(&local_329);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_350,"ADD_VALUE",
                 (allocator<char> *)(type.field_2._M_local_buf + 0xf));
      CodeWriter::SetValue(&this->code_,&local_350,(string *)local_1e8);
      std::__cxx11::string::~string((string *)&local_350);
      std::allocator<char>::~allocator((allocator<char> *)(type.field_2._M_local_buf + 0xf));
      if (bVar2) {
        GenTypeWire_abi_cxx11_
                  ((string *)local_378,this,&(this_00->value).type,"",false,
                   (bool)(this_00->offset64 & 1));
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_398,"ADD_FN",&local_399)
        ;
        std::operator+(&local_3e0,"AddElement<",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_378);
        std::operator+(&local_3c0,&local_3e0,">");
        CodeWriter::SetValue(&this->code_,&local_398,&local_3c0);
        std::__cxx11::string::~string((string *)&local_3c0);
        std::__cxx11::string::~string((string *)&local_3e0);
        std::__cxx11::string::~string((string *)&local_398);
        std::allocator<char>::~allocator(&local_399);
        std::__cxx11::string::~string((string *)local_378);
      }
      else {
        bVar2 = IsStruct(&(this_00->value).type);
        if (bVar2) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_400,"ADD_FN",&local_401);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_428,"AddStruct",&local_429);
          CodeWriter::SetValue(&this->code_,&local_400,&local_428);
          std::__cxx11::string::~string((string *)&local_428);
          std::allocator<char>::~allocator(&local_429);
          std::__cxx11::string::~string((string *)&local_400);
          std::allocator<char>::~allocator(&local_401);
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_450,"ADD_FN",&local_451);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_478,"AddOffset",&local_479);
          CodeWriter::SetValue(&this->code_,&local_450,&local_478);
          std::__cxx11::string::~string((string *)&local_478);
          std::allocator<char>::~allocator(&local_479);
          std::__cxx11::string::~string((string *)&local_450);
          std::allocator<char>::~allocator(&local_451);
        }
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_4a0,"  void add_{{FIELD_NAME}}({{FIELD_TYPE}}{{FIELD_NAME}}) {",
                 &local_4a1);
      CodeWriter::operator+=(&this->code_,&local_4a0);
      std::__cxx11::string::~string((string *)&local_4a0);
      std::allocator<char>::~allocator(&local_4a1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_4c8,"    fbb_.{{ADD_FN}}(\\",&local_4c9);
      CodeWriter::operator+=(&this->code_,&local_4c8);
      std::__cxx11::string::~string((string *)&local_4c8);
      std::allocator<char>::~allocator(&local_4c9);
      if ((local_d79 & 1) == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_518,"{{ADD_OFFSET}}, {{ADD_NAME}});",&local_519);
        CodeWriter::operator+=(&this->code_,&local_518);
        std::__cxx11::string::~string((string *)&local_518);
        std::allocator<char>::~allocator(&local_519);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_4f0,"{{ADD_OFFSET}}, {{ADD_NAME}}, {{ADD_VALUE}});",&local_4f1);
        CodeWriter::operator+=(&this->code_,&local_4f0);
        std::__cxx11::string::~string((string *)&local_4f0);
        std::allocator<char>::~allocator(&local_4f1);
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_540,"  }",&local_541);
      CodeWriter::operator+=(&this->code_,&local_540);
      std::__cxx11::string::~string((string *)&local_540);
      std::allocator<char>::~allocator(&local_541);
      std::__cxx11::string::~string((string *)local_1e8);
      std::__cxx11::string::~string((string *)local_1a8);
      std::__cxx11::string::~string((string *)(name.field_2._M_local_buf + 8));
    }
    __gnu_cxx::
    __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
    ::operator++(&local_150);
  }
  GetBuilder_abi_cxx11_(&local_5a8,this);
  std::operator+(&local_588,"  explicit {{STRUCT_NAME}}Builder(",&local_5a8);
  std::operator+(&local_568,&local_588," &_fbb)");
  CodeWriter::operator+=(&this->code_,&local_568);
  std::__cxx11::string::~string((string *)&local_568);
  std::__cxx11::string::~string((string *)&local_588);
  std::__cxx11::string::~string((string *)&local_5a8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5c8,"        : fbb_(_fbb) {",&local_5c9);
  CodeWriter::operator+=(&this->code_,&local_5c8);
  std::__cxx11::string::~string((string *)&local_5c8);
  std::allocator<char>::~allocator(&local_5c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5f0,"    start_ = fbb_.StartTable();",&local_5f1);
  CodeWriter::operator+=(&this->code_,&local_5f0);
  std::__cxx11::string::~string((string *)&local_5f0);
  std::allocator<char>::~allocator(&local_5f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_618,"  }",&local_619);
  CodeWriter::operator+=(&this->code_,&local_618);
  std::__cxx11::string::~string((string *)&local_618);
  std::allocator<char>::~allocator(&local_619);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_640,"  ::flatbuffers::Offset<{{STRUCT_NAME}}> Finish() {",&local_641);
  CodeWriter::operator+=(&this->code_,&local_640);
  std::__cxx11::string::~string((string *)&local_640);
  std::allocator<char>::~allocator(&local_641);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_668,"    const auto end = fbb_.EndTable(start_);",&local_669);
  CodeWriter::operator+=(&this->code_,&local_668);
  std::__cxx11::string::~string((string *)&local_668);
  std::allocator<char>::~allocator(&local_669);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_690,"    auto o = ::flatbuffers::Offset<{{STRUCT_NAME}}>(end);",
             (allocator<char> *)((long)&__range2 + 7));
  CodeWriter::operator+=(&this->code_,&local_690);
  std::__cxx11::string::~string((string *)&local_690);
  std::allocator<char>::~allocator((allocator<char> *)((long)&__range2 + 7));
  pvVar6 = &(local_18->fields).vec;
  __end2 = std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::begin
                     (pvVar6);
  field_1 = (FieldDef **)
            std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::end
                      (pvVar6);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
                                     *)&field_1), bVar2) {
    local_6b8 = __gnu_cxx::
                __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
                ::operator*(&__end2);
    if ((((*local_6b8)->deprecated & 1U) == 0) && (bVar2 = FieldDef::IsRequired(*local_6b8), bVar2))
    {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_6d8,"FIELD_NAME",&local_6d9);
      Name_abi_cxx11_(&local_700,this,*local_6b8);
      CodeWriter::SetValue(&this->code_,&local_6d8,&local_700);
      std::__cxx11::string::~string((string *)&local_700);
      std::__cxx11::string::~string((string *)&local_6d8);
      std::allocator<char>::~allocator(&local_6d9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_720,"OFFSET_NAME",&local_721);
      GenFieldOffsetName_abi_cxx11_(&local_748,this,*local_6b8);
      CodeWriter::SetValue(&this->code_,&local_720,&local_748);
      std::__cxx11::string::~string((string *)&local_748);
      std::__cxx11::string::~string((string *)&local_720);
      std::allocator<char>::~allocator(&local_721);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_768,"    fbb_.Required(o, {{STRUCT_NAME}}::{{OFFSET_NAME}});",
                 &local_769);
      CodeWriter::operator+=(&this->code_,&local_768);
      std::__cxx11::string::~string((string *)&local_768);
      std::allocator<char>::~allocator(&local_769);
    }
    __gnu_cxx::
    __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
    ::operator++(&__end2);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_790,"    return o;",&local_791);
  CodeWriter::operator+=(&this->code_,&local_790);
  std::__cxx11::string::~string((string *)&local_790);
  std::allocator<char>::~allocator(&local_791);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_7b8,"  }",&local_7b9);
  CodeWriter::operator+=(&this->code_,&local_7b8);
  std::__cxx11::string::~string((string *)&local_7b8);
  std::allocator<char>::~allocator(&local_7b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_7e0,"};",&local_7e1);
  CodeWriter::operator+=(&this->code_,&local_7e0);
  std::__cxx11::string::~string((string *)&local_7e0);
  std::allocator<char>::~allocator(&local_7e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_808,"",&local_809);
  CodeWriter::operator+=(&this->code_,&local_808);
  std::__cxx11::string::~string((string *)&local_808);
  std::allocator<char>::~allocator(&local_809);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_830,
             "inline ::flatbuffers::Offset<{{STRUCT_NAME}}> Create{{STRUCT_NAME}}(",&local_831);
  CodeWriter::operator+=(&this->code_,&local_830);
  std::__cxx11::string::~string((string *)&local_830);
  std::allocator<char>::~allocator(&local_831);
  GetBuilder_abi_cxx11_((string *)&__range2_1,this);
  std::operator+(&local_878,"    ",(string *)&__range2_1);
  std::operator+(&local_858,&local_878," &_fbb\\");
  CodeWriter::operator+=(&this->code_,&local_858);
  std::__cxx11::string::~string((string *)&local_858);
  std::__cxx11::string::~string((string *)&local_878);
  std::__cxx11::string::~string((string *)&__range2_1);
  pvVar6 = &(local_18->fields).vec;
  __end2_1 = std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::begin
                       (pvVar6);
  field_2 = (FieldDef **)
            std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::end
                      (pvVar6);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end2_1,
                            (__normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
                             *)&field_2), bVar2) {
    local_8b8 = __gnu_cxx::
                __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
                ::operator*(&__end2_1);
    if (((*local_8b8)->deprecated & 1U) == 0) {
      GenParam(this,*local_8b8,false,",\n    ");
    }
    __gnu_cxx::
    __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
    ::operator++(&__end2_1);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_8d8,") {",&local_8d9);
  CodeWriter::operator+=(&this->code_,&local_8d8);
  std::__cxx11::string::~string((string *)&local_8d8);
  std::allocator<char>::~allocator(&local_8d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_900,"  {{STRUCT_NAME}}Builder builder_(_fbb);",
             (allocator<char> *)((long)&size + 7));
  CodeWriter::operator+=(&this->code_,&local_900);
  std::__cxx11::string::~string((string *)&local_900);
  std::allocator<char>::~allocator((allocator<char> *)((long)&size + 7));
  it_1.current._M_current =
       (__normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
        )(FieldDef **)0x1;
  if ((local_18->sortbysize & 1U) != 0) {
    it_1.current._M_current =
         (__normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
          )(FieldDef **)0x8;
  }
  for (; it_1.current._M_current != (FieldDef **)0x0;
      it_1.current._M_current =
           (__normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
            )((ulong)it_1.current._M_current >> 1)) {
    std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::rbegin
              ((vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> *)
               local_918);
    while( true ) {
      std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::rend
                ((vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> *)
                 &field_3);
      bVar2 = std::operator!=((reverse_iterator<__gnu_cxx::__normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>_>
                               *)local_918,
                              (reverse_iterator<__gnu_cxx::__normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>_>
                               *)&field_3);
      if (!bVar2) break;
      ppFVar7 = std::
                reverse_iterator<__gnu_cxx::__normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>_>
                ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>_>
                             *)local_918);
      cVar1 = it_1;
      local_928 = *ppFVar7;
      if (((local_928->deprecated & 1U) == 0) &&
         (((local_18->sortbysize & 1U) == 0 ||
          (_Var8._M_current = (FieldDef **)SizeOf((local_928->value).type.base_type),
          cVar1.current._M_current ==
          (__normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
           )_Var8._M_current)))) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_948,"FIELD_NAME",&local_949);
        Name_abi_cxx11_(&local_970,this,local_928);
        CodeWriter::SetValue(&this->code_,&local_948,&local_970);
        std::__cxx11::string::~string((string *)&local_970);
        std::__cxx11::string::~string((string *)&local_948);
        std::allocator<char>::~allocator(&local_949);
        bVar2 = FieldDef::IsScalarOptional(local_928);
        if (bVar2) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_990,
                     "  if({{FIELD_NAME}}) { builder_.add_{{FIELD_NAME}}(*{{FIELD_NAME}}); }",
                     &local_991);
          CodeWriter::operator+=(&this->code_,&local_990);
          std::__cxx11::string::~string((string *)&local_990);
          std::allocator<char>::~allocator(&local_991);
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_9b8,"  builder_.add_{{FIELD_NAME}}({{FIELD_NAME}});",
                     &local_9b9);
          CodeWriter::operator+=(&this->code_,&local_9b8);
          std::__cxx11::string::~string((string *)&local_9b8);
          std::allocator<char>::~allocator(&local_9b9);
        }
      }
      std::
      reverse_iterator<__gnu_cxx::__normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>_>
      ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>_>
                    *)local_918);
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_9e0,"  return builder_.Finish();",&local_9e1);
  CodeWriter::operator+=(&this->code_,&local_9e0);
  std::__cxx11::string::~string((string *)&local_9e0);
  std::allocator<char>::~allocator(&local_9e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a08,"}",&local_a09);
  CodeWriter::operator+=(&this->code_,&local_a08);
  std::__cxx11::string::~string((string *)&local_a08);
  std::allocator<char>::~allocator(&local_a09);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a30,"",&local_a31);
  CodeWriter::operator+=(&this->code_,&local_a30);
  std::__cxx11::string::~string((string *)&local_a30);
  std::allocator<char>::~allocator(&local_a31);
  if (1 < *(int *)&(this->opts_).super_IDLOptions.field_0x30c) {
    GenTraitsStruct(this,local_18);
  }
  if ((((this->opts_).super_IDLOptions.cpp_direct_copy & 1U) != 0) &&
     ((it._M_current._6_1_ & 1) != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a58,
               "inline ::flatbuffers::Offset<{{STRUCT_NAME}}> Create{{STRUCT_NAME}}Direct(",
               &local_a59);
    CodeWriter::operator+=(&this->code_,&local_a58);
    std::__cxx11::string::~string((string *)&local_a58);
    std::allocator<char>::~allocator(&local_a59);
    GetBuilder_abi_cxx11_((string *)&__range3,this);
    std::operator+(&local_aa0,"    ",(string *)&__range3);
    std::operator+(&local_a80,&local_aa0," &_fbb\\");
    CodeWriter::operator+=(&this->code_,&local_a80);
    std::__cxx11::string::~string((string *)&local_a80);
    std::__cxx11::string::~string((string *)&local_aa0);
    std::__cxx11::string::~string((string *)&__range3);
    pvVar6 = &(local_18->fields).vec;
    __end3 = std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::begin
                       (pvVar6);
    field_4 = (FieldDef **)
              std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::end
                        (pvVar6);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
                                       *)&field_4), bVar2) {
      qualified_create_name.field_2._8_8_ =
           __gnu_cxx::
           __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
           ::operator*(&__end3);
      if (((*(FieldDef **)qualified_create_name.field_2._8_8_)->deprecated & 1U) == 0) {
        GenParam(this,*(FieldDef **)qualified_create_name.field_2._8_8_,true,",\n    ");
      }
      __gnu_cxx::
      __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
      ::operator++(&__end3);
    }
    this_01 = (local_18->super_Definition).defined_namespace;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b20,"Create",&local_b21);
    Namespace::GetFullyQualifiedName((string *)local_b00,this_01,&local_b20,1000);
    std::__cxx11::string::~string((string *)&local_b20);
    std::allocator<char>::~allocator(&local_b21);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b48,"CREATE_NAME",&local_b49);
    TranslateNameSpace(&local_b70,(string *)local_b00);
    CodeWriter::SetValue(&this->code_,&local_b48,&local_b70);
    std::__cxx11::string::~string((string *)&local_b70);
    std::__cxx11::string::~string((string *)&local_b48);
    std::allocator<char>::~allocator(&local_b49);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b90,") {",&local_b91);
    CodeWriter::operator+=(&this->code_,&local_b90);
    std::__cxx11::string::~string((string *)&local_b90);
    std::allocator<char>::~allocator(&local_b91);
    object = local_18;
    local_bc0.this = this;
    std::function<void(flatbuffers::FieldDef_const*)>::
    function<flatbuffers::cpp::CppGenerator::GenBuilders(flatbuffers::StructDef_const&)::_lambda(flatbuffers::FieldDef_const*)_1_,void>
              ((function<void(flatbuffers::FieldDef_const*)> *)&local_bb8,&local_bc0);
    ForAllFieldsOrderedByOffset(object,&local_bb8);
    std::function<void_(const_flatbuffers::FieldDef_*)>::~function(&local_bb8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_be0,"  return {{CREATE_NAME}}{{STRUCT_NAME}}(",&local_be1);
    CodeWriter::operator+=(&this->code_,&local_be0);
    std::__cxx11::string::~string((string *)&local_be0);
    std::allocator<char>::~allocator(&local_be1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c08,"      _fbb\\",(allocator<char> *)((long)&__range3_1 + 7));
    CodeWriter::operator+=(&this->code_,&local_c08);
    std::__cxx11::string::~string((string *)&local_c08);
    std::allocator<char>::~allocator((allocator<char> *)((long)&__range3_1 + 7));
    pvVar6 = &(local_18->fields).vec;
    __end3_1 = std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::begin
                         (pvVar6);
    field_5 = (FieldDef **)
              std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::end
                        (pvVar6);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end3_1,
                              (__normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
                               *)&field_5), bVar2) {
      local_c30 = __gnu_cxx::
                  __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
                  ::operator*(&__end3_1);
      if (((*local_c30)->deprecated & 1U) == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_c50,"FIELD_NAME",&local_c51);
        Name_abi_cxx11_(&local_c78,this,*local_c30);
        CodeWriter::SetValue(&this->code_,&local_c50,&local_c78);
        std::__cxx11::string::~string((string *)&local_c78);
        std::__cxx11::string::~string((string *)&local_c50);
        std::allocator<char>::~allocator(&local_c51);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_c98,",\n      {{FIELD_NAME}}\\",&local_c99);
        CodeWriter::operator+=(&this->code_,&local_c98);
        std::__cxx11::string::~string((string *)&local_c98);
        std::allocator<char>::~allocator(&local_c99);
        bVar2 = IsString(&((*local_c30)->value).type);
        if ((bVar2) || (bVar2 = IsVector(&((*local_c30)->value).type), bVar2)) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_cc0,"__\\",&local_cc1)
          ;
          CodeWriter::operator+=(&this->code_,&local_cc0);
          std::__cxx11::string::~string((string *)&local_cc0);
          std::allocator<char>::~allocator(&local_cc1);
        }
      }
      __gnu_cxx::
      __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
      ::operator++(&__end3_1);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_ce8,");",&local_ce9);
    CodeWriter::operator+=(&this->code_,&local_ce8);
    std::__cxx11::string::~string((string *)&local_ce8);
    std::allocator<char>::~allocator(&local_ce9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_d10,"}",&local_d11);
    CodeWriter::operator+=(&this->code_,&local_d10);
    std::__cxx11::string::~string((string *)&local_d10);
    std::allocator<char>::~allocator(&local_d11);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_d38,"",&local_d39);
    CodeWriter::operator+=(&this->code_,&local_d38);
    std::__cxx11::string::~string((string *)&local_d38);
    std::allocator<char>::~allocator(&local_d39);
    std::__cxx11::string::~string((string *)local_b00);
  }
  return;
}

Assistant:

void GenBuilders(const StructDef &struct_def) {
    code_.SetValue("STRUCT_NAME", Name(struct_def));

    // Generate a builder struct:
    code_ += "struct {{STRUCT_NAME}}Builder {";
    code_ += "  typedef {{STRUCT_NAME}} Table;";
    code_ += "  " + GetBuilder() + " &fbb_;";
    code_ += "  ::flatbuffers::uoffset_t start_;";

    bool has_string_or_vector_fields = false;
    for (auto it = struct_def.fields.vec.begin();
         it != struct_def.fields.vec.end(); ++it) {
      const auto &field = **it;
      if (field.deprecated) continue;
      const bool is_scalar = IsScalar(field.value.type.base_type);
      const bool is_default_scalar = is_scalar && !field.IsScalarOptional();
      const bool is_string = IsString(field.value.type);
      const bool is_vector = IsVector(field.value.type);
      if (is_string || is_vector) { has_string_or_vector_fields = true; }

      std::string offset = GenFieldOffsetName(field);
      std::string name = GenUnderlyingCast(field, false, Name(field));
      std::string value = is_default_scalar ? GenDefaultConstant(field) : "";

      // Generate accessor functions of the form:
      // void add_name(type name) {
      //   fbb_.AddElement<type>(offset, name, default);
      // }
      code_.SetValue("FIELD_NAME", Name(field));
      code_.SetValue("FIELD_TYPE",
                     GenTypeWire(field.value.type, " ", true, field.offset64));
      code_.SetValue("ADD_OFFSET", Name(struct_def) + "::" + offset);
      code_.SetValue("ADD_NAME", name);
      code_.SetValue("ADD_VALUE", value);
      if (is_scalar) {
        const auto type =
            GenTypeWire(field.value.type, "", false, field.offset64);
        code_.SetValue("ADD_FN", "AddElement<" + type + ">");
      } else if (IsStruct(field.value.type)) {
        code_.SetValue("ADD_FN", "AddStruct");
      } else {
        code_.SetValue("ADD_FN", "AddOffset");
      }

      code_ += "  void add_{{FIELD_NAME}}({{FIELD_TYPE}}{{FIELD_NAME}}) {";
      code_ += "    fbb_.{{ADD_FN}}(\\";
      if (is_default_scalar) {
        code_ += "{{ADD_OFFSET}}, {{ADD_NAME}}, {{ADD_VALUE}});";
      } else {
        code_ += "{{ADD_OFFSET}}, {{ADD_NAME}});";
      }
      code_ += "  }";
    }

    // Builder constructor
    code_ += "  explicit {{STRUCT_NAME}}Builder(" + GetBuilder() +
             " "
             "&_fbb)";
    code_ += "        : fbb_(_fbb) {";
    code_ += "    start_ = fbb_.StartTable();";
    code_ += "  }";

    // Finish() function.
    code_ += "  ::flatbuffers::Offset<{{STRUCT_NAME}}> Finish() {";
    code_ += "    const auto end = fbb_.EndTable(start_);";
    code_ += "    auto o = ::flatbuffers::Offset<{{STRUCT_NAME}}>(end);";

    for (const auto &field : struct_def.fields.vec) {
      if (!field->deprecated && field->IsRequired()) {
        code_.SetValue("FIELD_NAME", Name(*field));
        code_.SetValue("OFFSET_NAME", GenFieldOffsetName(*field));
        code_ += "    fbb_.Required(o, {{STRUCT_NAME}}::{{OFFSET_NAME}});";
      }
    }
    code_ += "    return o;";
    code_ += "  }";
    code_ += "};";
    code_ += "";

    // Generate a convenient CreateX function that uses the above builder
    // to create a table in one go.
    code_ +=
        "inline ::flatbuffers::Offset<{{STRUCT_NAME}}> "
        "Create{{STRUCT_NAME}}(";
    code_ += "    " + GetBuilder() + " &_fbb\\";
    for (const auto &field : struct_def.fields.vec) {
      if (!field->deprecated) { GenParam(*field, false, ",\n    "); }
    }
    code_ += ") {";

    code_ += "  {{STRUCT_NAME}}Builder builder_(_fbb);";
    for (size_t size = struct_def.sortbysize ? sizeof(largest_scalar_t) : 1;
         size; size /= 2) {
      for (auto it = struct_def.fields.vec.rbegin();
           it != struct_def.fields.vec.rend(); ++it) {
        const auto &field = **it;
        if (!field.deprecated && (!struct_def.sortbysize ||
                                  size == SizeOf(field.value.type.base_type))) {
          code_.SetValue("FIELD_NAME", Name(field));
          if (field.IsScalarOptional()) {
            code_ +=
                "  if({{FIELD_NAME}}) { "
                "builder_.add_{{FIELD_NAME}}(*{{FIELD_NAME}}); }";
          } else {
            code_ += "  builder_.add_{{FIELD_NAME}}({{FIELD_NAME}});";
          }
        }
      }
    }
    code_ += "  return builder_.Finish();";
    code_ += "}";
    code_ += "";

    // Definition for type traits for this table type. This allows querying var-
    // ious compile-time traits of the table.
    if (opts_.g_cpp_std >= cpp::CPP_STD_17) { GenTraitsStruct(struct_def); }

    // Generate a CreateXDirect function with vector types as parameters
    if (opts_.cpp_direct_copy && has_string_or_vector_fields) {
      code_ +=
          "inline ::flatbuffers::Offset<{{STRUCT_NAME}}> "
          "Create{{STRUCT_NAME}}Direct(";
      code_ += "    " + GetBuilder() + " &_fbb\\";
      for (const auto &field : struct_def.fields.vec) {
        if (!field->deprecated) { GenParam(*field, true, ",\n    "); }
      }
      // Need to call "Create" with the struct namespace.
      const auto qualified_create_name =
          struct_def.defined_namespace->GetFullyQualifiedName("Create");
      code_.SetValue("CREATE_NAME", TranslateNameSpace(qualified_create_name));
      code_ += ") {";
      // Offset64 bit fields need to be added to the buffer first, so here we
      // loop over the fields in order of their offset size, followed by their
      // definition order. Otherwise the emitted code might add a Offset
      // followed by an Offset64 which would trigger an assertion.

      // TODO(derekbailey): maybe optimize for the case where there is no
      // 64offsets in the whole schema?
      ForAllFieldsOrderedByOffset(struct_def, [&](const FieldDef *field) {
        if (field->deprecated) { return; }
        code_.SetValue("FIELD_NAME", Name(*field));
        if (IsString(field->value.type)) {
          if (!field->shared) {
            code_.SetValue(
                "CREATE_STRING",
                "CreateString" + std::string(field->offset64
                                                 ? "<::flatbuffers::Offset64>"
                                                 : ""));
          } else {
            code_.SetValue("CREATE_STRING", "CreateSharedString");
          }
          code_ +=
              "  auto {{FIELD_NAME}}__ = {{FIELD_NAME}} ? "
              "_fbb.{{CREATE_STRING}}({{FIELD_NAME}}) : 0;";
        } else if (IsVector(field->value.type)) {
          const std::string force_align_code =
              GenVectorForceAlign(*field, Name(*field) + "->size()");
          if (!force_align_code.empty()) {
            code_ += "  if ({{FIELD_NAME}}) { " + force_align_code + " }";
          }
          code_ += "  auto {{FIELD_NAME}}__ = {{FIELD_NAME}} ? \\";
          const auto vtype = field->value.type.VectorType();
          const auto has_key = TypeHasKey(vtype);
          if (IsStruct(vtype)) {
            const std::string type = WrapInNameSpace(*vtype.struct_def);
            if (has_key) {
              code_ += "_fbb.CreateVectorOfSortedStructs<" + type + ">\\";
            } else {
              // If the field uses 64-bit addressing, create a 64-bit vector.
              if (field->value.type.base_type == BASE_TYPE_VECTOR64) {
                code_ += "_fbb.CreateVectorOfStructs64\\";
              } else {
                code_ += "_fbb.CreateVectorOfStructs\\";
                if (field->offset64) {
                  // This is normal 32-bit vector, with 64-bit addressing.
                  code_ += "64<::flatbuffers::Vector>\\";
                } else {
                  code_ += "<" + type + ">\\";
                }
              }
            }
          } else if (has_key) {
            const auto type = WrapInNameSpace(*vtype.struct_def);
            code_ += "_fbb.CreateVectorOfSortedTables<" + type + ">\\";
          } else {
            const auto type = GenTypeWire(
                vtype, "", VectorElementUserFacing(vtype), field->offset64);

            if (field->value.type.base_type == BASE_TYPE_VECTOR64) {
              code_ += "_fbb.CreateVector64\\";
            } else {
              // If the field uses 64-bit addressing, create a 64-bit vector.
              code_.SetValue("64OFFSET", field->offset64 ? "64" : "");
              code_.SetValue("TYPE",
                             field->offset64 ? "::flatbuffers::Vector" : type);

              code_ += "_fbb.CreateVector{{64OFFSET}}<{{TYPE}}>\\";
            }
          }
          code_ += has_key ? "({{FIELD_NAME}}) : 0;" : "(*{{FIELD_NAME}}) : 0;";
        }
      });
      code_ += "  return {{CREATE_NAME}}{{STRUCT_NAME}}(";
      code_ += "      _fbb\\";
      for (const auto &field : struct_def.fields.vec) {
        if (field->deprecated) { continue; }
        code_.SetValue("FIELD_NAME", Name(*field));
        code_ += ",\n      {{FIELD_NAME}}\\";
        if (IsString(field->value.type) || IsVector(field->value.type)) {
          code_ += "__\\";
        }
      }
      code_ += ");";
      code_ += "}";
      code_ += "";
    }
  }